

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_interp_encode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  uint64_t in_RDX;
  undefined8 *in_RSI;
  uint64_t _B_x_1;
  int64_t _B_thresh;
  int64_t _B_logofb;
  int64_t _B_nbits;
  int64_t _B_b;
  int64_t _B_x;
  uint64_t stack_pointer;
  int64_t range;
  int64_t mid;
  int64_t hi;
  int64_t lo;
  uint64_t in_stack_ffffffffffffff78;
  bit_io_t *in_stack_ffffffffffffff80;
  ulong local_70;
  long local_40;
  
  *in_RSI = 0;
  in_RSI[in_RDX] = 0x8000000;
  uVar4 = shuff_interp_encode::ss;
  uVar3 = SHUFF_ceil_log2(in_RDX);
  if (uVar4 < uVar3 + 1) {
    in_stack_ffffffffffffff80 = (bit_io_t *)shuff_interp_encode::s;
    uVar4 = SHUFF_ceil_log2(in_RDX);
    shuff_interp_encode::s = (stack *)realloc(in_stack_ffffffffffffff80,(uVar4 + 1) * 0x10);
    if (shuff_interp_encode::s == (stack *)0x0) {
      fprintf(_stderr,"Out of memory for stack\n");
      exit(-1);
    }
    uVar4 = SHUFF_ceil_log2(in_RDX);
    shuff_interp_encode::ss = uVar4 + 1;
  }
  shuff_interp_encode::s->lo = 0;
  shuff_interp_encode::s->hi = in_RDX;
  local_40 = 1;
  while (local_40 != 0) {
    lVar1 = shuff_interp_encode::s[local_40 + -1].lo;
    lVar2 = shuff_interp_encode::s[local_40 + -1].hi;
    lVar5 = local_40 + -1;
    lVar6 = lVar1 + (lVar2 - lVar1 >> 1);
    for (local_70 = ((in_RSI[lVar2] - in_RSI[lVar1]) - ((lVar2 - lVar1) + -1)) - 1; local_70 != 0;
        local_70 = local_70 >> 1) {
    }
    SHUFF_OUTPUT_ULONG(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,'\0');
    if ((1 < lVar2 - lVar6) && ((ulong)(lVar2 - lVar6) < (ulong)(in_RSI[lVar2] - in_RSI[lVar6]))) {
      shuff_interp_encode::s[lVar5].lo = lVar6;
      shuff_interp_encode::s[lVar5].hi = lVar2;
      lVar5 = local_40;
    }
    local_40 = lVar5;
    if ((1 < lVar6 - lVar1) && ((ulong)(lVar6 - lVar1) < (ulong)(in_RSI[lVar6] - in_RSI[lVar1]))) {
      shuff_interp_encode::s[local_40].lo = lVar1;
      shuff_interp_encode::s[local_40].hi = lVar6;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void shuff_interp_encode(bit_io_t* bio, uint64_t* A, uint64_t n)
{
    int64_t lo, hi, mid, range;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_ENCODE(bio, A[mid] - (A[lo] + (mid - lo - 1)), range);
        if ((hi - mid > 1) && (A[hi] - A[mid] > (uint64_t)(hi - mid)))
            SHUFF_PUSH(mid, hi);
        if ((mid - lo > 1) && (A[mid] - A[lo] > (uint64_t)(mid - lo)))
            SHUFF_PUSH(lo, mid);
    }
}